

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3GenerateConstraintChecks
               (Parse *pParse,Table *pTab,int *aRegIdx,int iDataCur,int iIdxCur,int regNewData,
               int regOldData,u8 pkChng,u8 overrideError,int ignoreDest,int *pbMayReplace)

{
  sqlite3 *db_00;
  ExprList *pEVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vdbe *p;
  long in_RDX;
  Table *in_RSI;
  Parse *in_RDI;
  int in_R9D;
  bool bVar6;
  int in_stack_00000008;
  char in_stack_00000010;
  byte in_stack_00000018;
  undefined4 *in_stack_00000028;
  Trigger *pTrigger_1;
  char *p4;
  int regCmp;
  int op;
  int addrJump;
  int x_1;
  int x;
  int iField;
  int addrUniqueOk;
  int iThisCur;
  int regR;
  int regIdx;
  Trigger *pTrigger;
  int addrRowidOk;
  char *zName;
  int allOk;
  ExprList *pCheck;
  char *zMsg;
  int regRowid;
  u8 bAffinityDone;
  u8 isUpdate;
  int ipkBottom;
  int ipkTop;
  int nPkField;
  int seenReplace;
  int j1;
  int onError;
  int nCol;
  int ix;
  int i;
  sqlite3 *db;
  Index *pPk;
  Index *pIdx;
  Vdbe *v;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  uint in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  undefined6 in_stack_fffffffffffffef8;
  u8 in_stack_fffffffffffffefe;
  i8 in_stack_fffffffffffffeff;
  uint in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  uint in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  Expr *in_stack_ffffffffffffff18;
  Parse *in_stack_ffffffffffffff20;
  Table *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  u8 count;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  u8 onconf;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Trigger *in_stack_ffffffffffffff58;
  int local_74;
  int local_68;
  uint local_64;
  undefined4 local_60;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Index *local_40;
  Index *local_38;
  
  local_60 = 0;
  local_68 = 0;
  bVar2 = false;
  local_74 = -1;
  bVar6 = in_stack_00000008 != 0;
  db_00 = in_RDI->db;
  p = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  iVar3 = (int)in_RSI->nCol;
  if ((in_RSI->tabFlags & 0x20) == 0) {
    local_40 = (Index *)0x0;
    local_64 = 1;
  }
  else {
    local_40 = sqlite3PrimaryKeyIndex(in_RSI);
    local_64 = (uint)local_40->nKeyCol;
  }
  for (iVar8 = 0; iVar8 < iVar3; iVar8 = iVar8 + 1) {
    if ((iVar8 != in_RSI->iPKey) && (uVar7 = (uint)in_RSI->aCol[iVar8].notNull, uVar7 != 0)) {
      if (in_stack_00000018 == 10) {
        if (uVar7 == 10) {
          uVar7 = 2;
        }
      }
      else {
        uVar7 = (uint)in_stack_00000018;
      }
      if ((uVar7 == 5) && (in_RSI->aCol[iVar8].pDflt == (Expr *)0x0)) {
        uVar7 = 2;
      }
      in_stack_ffffffffffffff18 = (Expr *)(ulong)(uVar7 - 1);
      switch(in_stack_ffffffffffffff18) {
      case (Expr *)0x1:
        sqlite3MayAbort(in_RDI);
      case (Expr *)0x0:
      case (Expr *)0x2:
        sqlite3MPrintf(db_00,"%s.%s",in_RSI->zName,in_RSI->aCol[iVar8].zName);
        in_stack_fffffffffffffed8 = -1;
        sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                          in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
                          (char *)CONCAT44(in_stack_fffffffffffffedc,0xffffffff),
                          in_stack_ffffffffffffff00);
        sqlite3VdbeChangeP5(p,'\x01');
        break;
      case (Expr *)0x3:
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,0);
        break;
      default:
        sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
        sqlite3ExprCode((Parse *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (Expr *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0);
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc);
      }
    }
  }
  if ((in_RSI->pCheck != (ExprList *)0x0) && ((db_00->flags & 0x2000U) == 0)) {
    pEVar1 = in_RSI->pCheck;
    in_RDI->ckBase = in_R9D + 1;
    if (in_stack_00000018 == 10) {
      in_stack_ffffffffffffff14 = 2;
    }
    else {
      in_stack_ffffffffffffff14 = (uint)in_stack_00000018;
    }
    uVar7 = in_stack_ffffffffffffff14;
    for (iVar3 = 0; iVar3 < pEVar1->nExpr; iVar3 = iVar3 + 1) {
      iVar8 = sqlite3VdbeMakeLabel
                        ((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      sqlite3ExprIfTrue((Parse *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        (Expr *)in_stack_ffffffffffffff28,
                        (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                        (int)in_stack_ffffffffffffff20);
      if (uVar7 == 4) {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,0);
      }
      else {
        if (uVar7 == 5) {
          uVar7 = 2;
        }
        sqlite3HaltConstraint
                  ((Parse *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                   (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffeff,in_stack_fffffffffffffefe);
      }
      sqlite3VdbeResolveLabel(p,iVar8);
    }
  }
  if ((in_stack_00000010 == '\0') || (local_40 != (Index *)0x0)) goto LAB_001a48fb;
  iVar3 = sqlite3VdbeMakeLabel
                    ((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  in_stack_ffffffffffffff10 = (uint)in_RSI->keyConf;
  if (in_stack_00000018 == 10) {
    if (in_stack_ffffffffffffff10 == 10) {
      in_stack_ffffffffffffff10 = 2;
    }
  }
  else {
    in_stack_ffffffffffffff10 = (uint)in_stack_00000018;
  }
  if (bVar6) {
    sqlite3VdbeAddOp3((Vdbe *)CONCAT17(in_stack_fffffffffffffeff,
                                       CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)
                                      ),in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                      in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
    sqlite3VdbeChangeP5(p,0x90);
  }
  if ((in_stack_ffffffffffffff10 == 5) && (in_stack_00000018 != 5)) {
    for (local_38 = in_RSI->pIndex; local_38 != (Index *)0x0; local_38 = local_38->pNext) {
      if ((local_38->onError == '\x04') || (local_38->onError == '\x03')) {
        local_68 = sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,
                                                      in_stack_fffffffffffffee0),
                                     in_stack_fffffffffffffedc);
        break;
      }
    }
  }
  sqlite3VdbeAddOp3((Vdbe *)CONCAT17(in_stack_fffffffffffffeff,
                                     CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
                    in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                    in_stack_fffffffffffffee8);
  if (in_stack_ffffffffffffff10 - 1 < 3) {
LAB_001a4745:
    sqlite3RowidConstraint
              ((Parse *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec,
               (Table *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  else if (in_stack_ffffffffffffff10 == 4) {
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,0);
  }
  else {
    if (in_stack_ffffffffffffff10 != 5) goto LAB_001a4745;
    in_stack_ffffffffffffff58 = (Trigger *)0x0;
    if ((db_00->flags & 0x40000U) != 0) {
      in_stack_ffffffffffffff58 =
           sqlite3TriggersExist
                     ((Parse *)CONCAT44(in_stack_ffffffffffffff14,5),
                      (Table *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      in_stack_ffffffffffffff04,
                      (ExprList *)
                      CONCAT17(in_stack_fffffffffffffeff,
                               CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
                      (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    if ((in_stack_ffffffffffffff58 == (Trigger *)0x0) &&
       (iVar8 = sqlite3FkRequired((Parse *)CONCAT17(in_stack_fffffffffffffeff,
                                                    CONCAT16(in_stack_fffffffffffffefe,
                                                             in_stack_fffffffffffffef8)),
                                  (Table *)CONCAT44(in_stack_fffffffffffffef4,
                                                    in_stack_fffffffffffffef0),
                                  (int *)CONCAT44(in_stack_fffffffffffffeec,
                                                  in_stack_fffffffffffffee8),
                                  in_stack_fffffffffffffee4), iVar8 == 0)) {
      if (in_RSI->pIndex != (Index *)0x0) {
        sqlite3MultiWrite(in_RDI);
        sqlite3GenerateRowIndexDelete
                  ((Parse *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (Table *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,
                   (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
    }
    else {
      onconf = (u8)in_stack_ffffffffffffff50;
      count = (u8)in_stack_ffffffffffffff48;
      sqlite3MultiWrite(in_RDI);
      in_stack_fffffffffffffed8 = 1;
      in_stack_fffffffffffffee0 = 0;
      in_stack_fffffffffffffee8 = 5;
      in_stack_fffffffffffffef0 = 1;
      sqlite3GenerateRowDelete
                ((Parse *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28,(Trigger *)in_stack_ffffffffffffff20,
                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff14,(i16)in_stack_ffffffffffffff40,count,onconf,
                 (u8)in_stack_ffffffffffffff58);
    }
    local_60 = 1;
  }
  sqlite3VdbeResolveLabel(p,iVar3);
  if (local_68 != 0) {
    sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      in_stack_fffffffffffffedc);
    sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffedc);
  }
LAB_001a48fb:
  iVar3 = 0;
  local_38 = in_RSI->pIndex;
  do {
    if (local_38 == (Index *)0x0) {
      if (local_68 != 0) {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,0);
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc);
      }
      *in_stack_00000028 = local_60;
      return;
    }
    if (*(int *)(in_RDX + (long)iVar3 * 4) != 0) {
      if (!bVar2) {
        sqlite3TableAffinity
                  ((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (Table *)CONCAT17(in_stack_fffffffffffffeff,
                                     CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
                   in_stack_fffffffffffffef4);
        bVar2 = true;
      }
      iVar8 = sqlite3VdbeMakeLabel
                        ((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if (local_38->pPartIdxWhere != (Expr *)0x0) {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,0);
        in_RDI->ckBase = in_R9D + 1;
        sqlite3ExprIfFalse(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                           in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
        in_RDI->ckBase = 0;
      }
      iVar4 = sqlite3GetTempRange(in_RDI,(uint)local_38->nColumn);
      for (iVar9 = 0; iVar9 < (int)(uint)local_38->nColumn; iVar9 = iVar9 + 1) {
        iVar5 = (int)local_38->aiColumn[iVar9];
        if ((iVar5 < 0) || (iVar5 == in_RSI->iPKey)) {
          if (local_74 != iVar4 + iVar9) {
            in_stack_ffffffffffffff40 = in_R9D;
            if (local_38->pPartIdxWhere == (Expr *)0x0) {
              in_stack_ffffffffffffff0c = iVar4 + iVar9;
              local_74 = in_stack_ffffffffffffff0c;
            }
            else {
              in_stack_ffffffffffffff0c = -1;
              local_74 = in_stack_ffffffffffffff0c;
            }
            goto LAB_001a4afc;
          }
        }
        else {
          in_stack_ffffffffffffff40 = iVar5 + in_R9D + 1;
LAB_001a4afc:
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,0);
        }
      }
      sqlite3VdbeAddOp3((Vdbe *)CONCAT17(in_stack_fffffffffffffeff,
                                         CONCAT16(in_stack_fffffffffffffefe,
                                                  in_stack_fffffffffffffef8)),
                        in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                        in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      sqlite3ExprCacheAffinityChange
                ((Parse *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
      if (((bVar6) && (local_40 == local_38)) && (in_stack_00000010 == '\0')) {
        sqlite3VdbeResolveLabel(p,iVar8);
      }
      else {
        uVar7 = (uint)local_38->onError;
        if (uVar7 == 0) {
          sqlite3ReleaseTempRange
                    ((Parse *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
          sqlite3VdbeResolveLabel(p,iVar8);
        }
        else {
          if (in_stack_00000018 == 10) {
            if (uVar7 == 10) {
              uVar7 = 2;
            }
          }
          else {
            uVar7 = (uint)in_stack_00000018;
          }
          sqlite3VdbeAddOp4Int
                    ((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                     in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
          iVar9 = iVar4;
          if (local_38 != local_40) {
            iVar4 = sqlite3GetTempRange(in_RDI,local_64);
          }
          iVar5 = iVar4;
          if ((bVar6) || (uVar7 == 5)) {
            if ((in_RSI->tabFlags & 0x20) == 0) {
              sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0
                                                ),in_stack_fffffffffffffedc,
                                in_stack_fffffffffffffed8,0);
              if (bVar6) {
                sqlite3VdbeAddOp3((Vdbe *)CONCAT17(in_stack_fffffffffffffeff,
                                                   CONCAT16(in_stack_fffffffffffffefe,
                                                            in_stack_fffffffffffffef8)),
                                  in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                                  in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
                sqlite3VdbeChangeP5(p,0x90);
              }
            }
            else {
              if (local_38 != local_40) {
                for (iVar10 = 0; iVar10 < (int)(uint)local_40->nKeyCol; iVar10 = iVar10 + 1) {
                  sqlite3ColumnOfIndex(local_38,local_40->aiColumn[iVar10]);
                  sqlite3VdbeAddOp3((Vdbe *)CONCAT17(in_stack_fffffffffffffeff,
                                                     CONCAT16(in_stack_fffffffffffffefe,
                                                              in_stack_fffffffffffffef8)),
                                    in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                                    in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
                }
              }
              if (bVar6) {
                sqlite3VdbeCurrentAddr(p);
                in_stack_ffffffffffffff34 = 0x4e;
                in_stack_ffffffffffffff04 = iVar5;
                if ((local_38->field_0x5b & 3) == 2) {
                  in_stack_ffffffffffffff04 = iVar9;
                }
                in_stack_ffffffffffffff30 = in_stack_ffffffffffffff04;
                for (iVar10 = 0; iVar10 < (int)(uint)local_40->nKeyCol; iVar10 = iVar10 + 1) {
                  in_stack_ffffffffffffff28 =
                       (Table *)sqlite3LocateCollSeq
                                          ((Parse *)CONCAT44(in_stack_fffffffffffffef4,
                                                             in_stack_fffffffffffffef0),
                                           (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                            in_stack_fffffffffffffee8));
                  if (iVar10 == local_40->nKeyCol - 1) {
                    in_stack_ffffffffffffff34 = 0x4f;
                  }
                  in_stack_fffffffffffffed8 = -4;
                  sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,
                                                     in_stack_fffffffffffffef0),
                                    in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                                    in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
                                    (char *)CONCAT44(in_stack_fffffffffffffedc,0xfffffffc),
                                    in_stack_ffffffffffffff00);
                  sqlite3VdbeChangeP5(p,0x90);
                }
              }
            }
          }
          in_stack_ffffffffffffff00 = uVar7;
          if (in_stack_ffffffffffffff00 - 1 < 3) {
            sqlite3UniqueConstraint
                      ((Parse *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                       (Index *)in_stack_ffffffffffffff20);
          }
          else if (in_stack_ffffffffffffff00 == 4) {
            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,0);
          }
          else {
            in_stack_ffffffffffffff20 = (Parse *)0x0;
            sqlite3MultiWrite(in_RDI);
            if ((db_00->flags & 0x40000U) != 0) {
              in_stack_ffffffffffffff20 =
                   (Parse *)sqlite3TriggersExist
                                      ((Parse *)CONCAT44(in_stack_ffffffffffffff14,
                                                         in_stack_ffffffffffffff10),
                                       (Table *)CONCAT44(in_stack_ffffffffffffff0c,iVar4),
                                       in_stack_ffffffffffffff04,
                                       (ExprList *)
                                       CONCAT17(in_stack_fffffffffffffeff,
                                                CONCAT16(in_stack_fffffffffffffefe,
                                                         in_stack_fffffffffffffef8)),
                                       (int *)CONCAT44(in_stack_fffffffffffffef4,
                                                       in_stack_fffffffffffffef0));
            }
            in_stack_fffffffffffffed8 = (int)(short)local_64;
            in_stack_fffffffffffffee0 = 0;
            in_stack_fffffffffffffee8 = 5;
            in_stack_fffffffffffffef0 = (uint)(local_38 == local_40);
            sqlite3GenerateRowDelete
                      ((Parse *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff28,(Trigger *)in_stack_ffffffffffffff20,
                       (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       (int)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                       (i16)in_stack_ffffffffffffff40,(u8)iVar8,(u8)iVar5,
                       (u8)in_stack_ffffffffffffff58);
            local_60 = 1;
          }
          sqlite3VdbeResolveLabel(p,iVar8);
          sqlite3ReleaseTempRange
                    ((Parse *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
          if (iVar5 != iVar9) {
            sqlite3ReleaseTempRange
                      ((Parse *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
          }
        }
      }
    }
    local_38 = local_38->pNext;
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateConstraintChecks(
  Parse *pParse,       /* The parser context */
  Table *pTab,         /* The table being inserted or updated */
  int *aRegIdx,        /* Use register aRegIdx[i] for index i.  0 for unused */
  int iDataCur,        /* Canonical data cursor (main table or PK index) */
  int iIdxCur,         /* First index cursor */
  int regNewData,      /* First register in a range holding values to insert */
  int regOldData,      /* Previous content.  0 for INSERTs */
  u8 pkChng,           /* Non-zero if the rowid or PRIMARY KEY changed */
  u8 overrideError,    /* Override onError to this if not OE_Default */
  int ignoreDest,      /* Jump to this label on an OE_Ignore resolution */
  int *pbMayReplace    /* OUT: Set to true if constraint may cause a replace */
){
  Vdbe *v;             /* VDBE under constrution */
  Index *pIdx;         /* Pointer to one of the indices */
  Index *pPk = 0;      /* The PRIMARY KEY index */
  sqlite3 *db;         /* Database connection */
  int i;               /* loop counter */
  int ix;              /* Index loop counter */
  int nCol;            /* Number of columns */
  int onError;         /* Conflict resolution strategy */
  int j1;              /* Address of jump instruction */
  int seenReplace = 0; /* True if REPLACE is used to resolve INT PK conflict */
  int nPkField;        /* Number of fields in PRIMARY KEY. 1 for ROWID tables */
  int ipkTop = 0;      /* Top of the rowid change constraint check */
  int ipkBottom = 0;   /* Bottom of the rowid change constraint check */
  u8 isUpdate;         /* True if this is an UPDATE operation */
  u8 bAffinityDone = 0;  /* True if the OP_Affinity operation has been run */
  int regRowid = -1;   /* Register holding ROWID value */

  isUpdate = regOldData!=0;
  db = pParse->db;
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  nCol = pTab->nCol;
  
  /* pPk is the PRIMARY KEY index for WITHOUT ROWID tables and NULL for
  ** normal rowid tables.  nPkField is the number of key fields in the 
  ** pPk index or 1 for a rowid table.  In other words, nPkField is the
  ** number of fields in the true primary key of the table. */
  if( HasRowid(pTab) ){
    pPk = 0;
    nPkField = 1;
  }else{
    pPk = sqlite3PrimaryKeyIndex(pTab);
    nPkField = pPk->nKeyCol;
  }

  /* Record that this module has started */
  VdbeModuleComment((v, "BEGIN: GenCnstCks(%d,%d,%d,%d,%d)",
                     iDataCur, iIdxCur, regNewData, regOldData, pkChng));

  /* Test all NOT NULL constraints.
  */
  for(i=0; i<nCol; i++){
    if( i==pTab->iPKey ){
      continue;
    }
    onError = pTab->aCol[i].notNull;
    if( onError==OE_None ) continue;
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    if( onError==OE_Replace && pTab->aCol[i].pDflt==0 ){
      onError = OE_Abort;
    }
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace );
    switch( onError ){
      case OE_Abort:
        sqlite3MayAbort(pParse);
        /* Fall through */
      case OE_Rollback:
      case OE_Fail: {
        char *zMsg = sqlite3MPrintf(db, "%s.%s", pTab->zName,
                                    pTab->aCol[i].zName);
        sqlite3VdbeAddOp4(v, OP_HaltIfNull, SQLITE_CONSTRAINT_NOTNULL, onError,
                          regNewData+1+i, zMsg, P4_DYNAMIC);
        sqlite3VdbeChangeP5(v, P5_ConstraintNotNull);
        VdbeCoverage(v);
        break;
      }
      case OE_Ignore: {
        sqlite3VdbeAddOp2(v, OP_IsNull, regNewData+1+i, ignoreDest);
        VdbeCoverage(v);
        break;
      }
      default: {
        assert( onError==OE_Replace );
        j1 = sqlite3VdbeAddOp1(v, OP_NotNull, regNewData+1+i); VdbeCoverage(v);
        sqlite3ExprCode(pParse, pTab->aCol[i].pDflt, regNewData+1+i);
        sqlite3VdbeJumpHere(v, j1);
        break;
      }
    }
  }

  /* Test all CHECK constraints
  */
#ifndef SQLITE_OMIT_CHECK
  if( pTab->pCheck && (db->flags & SQLITE_IgnoreChecks)==0 ){
    ExprList *pCheck = pTab->pCheck;
    pParse->ckBase = regNewData+1;
    onError = overrideError!=OE_Default ? overrideError : OE_Abort;
    for(i=0; i<pCheck->nExpr; i++){
      int allOk = sqlite3VdbeMakeLabel(v);
      sqlite3ExprIfTrue(pParse, pCheck->a[i].pExpr, allOk, SQLITE_JUMPIFNULL);
      if( onError==OE_Ignore ){
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
      }else{
        char *zName = pCheck->a[i].zName;
        if( zName==0 ) zName = pTab->zName;
        if( onError==OE_Replace ) onError = OE_Abort; /* IMP: R-15569-63625 */
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_CHECK,
                              onError, zName, P4_TRANSIENT,
                              P5_ConstraintCheck);
      }
      sqlite3VdbeResolveLabel(v, allOk);
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* If rowid is changing, make sure the new rowid does not previously
  ** exist in the table.
  */
  if( pkChng && pPk==0 ){
    int addrRowidOk = sqlite3VdbeMakeLabel(v);

    /* Figure out what action to take in case of a rowid collision */
    onError = pTab->keyConf;
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }

    if( isUpdate ){
      /* pkChng!=0 does not mean that the rowid has change, only that
      ** it might have changed.  Skip the conflict logic below if the rowid
      ** is unchanged. */
      sqlite3VdbeAddOp3(v, OP_Eq, regNewData, addrRowidOk, regOldData);
      sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
      VdbeCoverage(v);
    }

    /* If the response to a rowid conflict is REPLACE but the response
    ** to some other UNIQUE constraint is FAIL or IGNORE, then we need
    ** to defer the running of the rowid conflict checking until after
    ** the UNIQUE constraints have run.
    */
    if( onError==OE_Replace && overrideError!=OE_Replace ){
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        if( pIdx->onError==OE_Ignore || pIdx->onError==OE_Fail ){
          ipkTop = sqlite3VdbeAddOp0(v, OP_Goto);
          break;
        }
      }
    }

    /* Check to see if the new rowid already exists in the table.  Skip
    ** the following conflict logic if it does not. */
    sqlite3VdbeAddOp3(v, OP_NotExists, iDataCur, addrRowidOk, regNewData);
    VdbeCoverage(v);

    /* Generate code that deals with a rowid collision */
    switch( onError ){
      default: {
        onError = OE_Abort;
        /* Fall thru into the next case */
      }
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        sqlite3RowidConstraint(pParse, onError, pTab);
        break;
      }
      case OE_Replace: {
        /* If there are DELETE triggers on this table and the
        ** recursive-triggers flag is set, call GenerateRowDelete() to
        ** remove the conflicting row from the table. This will fire
        ** the triggers and remove both the table and index b-tree entries.
        **
        ** Otherwise, if there are no triggers or the recursive-triggers
        ** flag is not set, but the table has one or more indexes, call 
        ** GenerateRowIndexDelete(). This removes the index b-tree entries 
        ** only. The table b-tree entry will be replaced by the new entry 
        ** when it is inserted.  
        **
        ** If either GenerateRowDelete() or GenerateRowIndexDelete() is called,
        ** also invoke MultiWrite() to indicate that this VDBE may require
        ** statement rollback (if the statement is aborted after the delete
        ** takes place). Earlier versions called sqlite3MultiWrite() regardless,
        ** but being more selective here allows statements like:
        **
        **   REPLACE INTO t(rowid) VALUES($newrowid)
        **
        ** to run without a statement journal if there are no indexes on the
        ** table.
        */
        Trigger *pTrigger = 0;
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        if( pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0) ){
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
                                   regNewData, 1, 0, OE_Replace, 1);
        }else if( pTab->pIndex ){
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowIndexDelete(pParse, pTab, iDataCur, iIdxCur, 0);
        }
        seenReplace = 1;
        break;
      }
      case OE_Ignore: {
        /*assert( seenReplace==0 );*/
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
        break;
      }
    }
    sqlite3VdbeResolveLabel(v, addrRowidOk);
    if( ipkTop ){
      ipkBottom = sqlite3VdbeAddOp0(v, OP_Goto);
      sqlite3VdbeJumpHere(v, ipkTop);
    }
  }

  /* Test all UNIQUE constraints by creating entries for each UNIQUE
  ** index and making sure that duplicate entries do not already exist.
  ** Compute the revised record entries for indices as we go.
  **
  ** This loop also handles the case of the PRIMARY KEY index for a
  ** WITHOUT ROWID table.
  */
  for(ix=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, ix++){
    int regIdx;          /* Range of registers hold conent for pIdx */
    int regR;            /* Range of registers holding conflicting PK */
    int iThisCur;        /* Cursor for this UNIQUE index */
    int addrUniqueOk;    /* Jump here if the UNIQUE constraint is satisfied */

    if( aRegIdx[ix]==0 ) continue;  /* Skip indices that do not change */
    if( bAffinityDone==0 ){
      sqlite3TableAffinity(v, pTab, regNewData+1);
      bAffinityDone = 1;
    }
    iThisCur = iIdxCur+ix;
    addrUniqueOk = sqlite3VdbeMakeLabel(v);

    /* Skip partial indices for which the WHERE clause is not true */
    if( pIdx->pPartIdxWhere ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, aRegIdx[ix]);
      pParse->ckBase = regNewData+1;
      sqlite3ExprIfFalse(pParse, pIdx->pPartIdxWhere, addrUniqueOk,
                         SQLITE_JUMPIFNULL);
      pParse->ckBase = 0;
    }

    /* Create a record for this index entry as it should appear after
    ** the insert or update.  Store that record in the aRegIdx[ix] register
    */
    regIdx = sqlite3GetTempRange(pParse, pIdx->nColumn);
    for(i=0; i<pIdx->nColumn; i++){
      int iField = pIdx->aiColumn[i];
      int x;
      if( iField<0 || iField==pTab->iPKey ){
        if( regRowid==regIdx+i ) continue; /* ROWID already in regIdx+i */
        x = regNewData;
        regRowid =  pIdx->pPartIdxWhere ? -1 : regIdx+i;
      }else{
        x = iField + regNewData + 1;
      }
      sqlite3VdbeAddOp2(v, OP_SCopy, x, regIdx+i);
      VdbeComment((v, "%s", iField<0 ? "rowid" : pTab->aCol[iField].zName));
    }
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regIdx, pIdx->nColumn, aRegIdx[ix]);
    VdbeComment((v, "for %s", pIdx->zName));
    sqlite3ExprCacheAffinityChange(pParse, regIdx, pIdx->nColumn);

    /* In an UPDATE operation, if this index is the PRIMARY KEY index 
    ** of a WITHOUT ROWID table and there has been no change the
    ** primary key, then no collision is possible.  The collision detection
    ** logic below can all be skipped. */
    if( isUpdate && pPk==pIdx && pkChng==0 ){
      sqlite3VdbeResolveLabel(v, addrUniqueOk);
      continue;
    }

    /* Find out what action to take in case there is a uniqueness conflict */
    onError = pIdx->onError;
    if( onError==OE_None ){ 
      sqlite3ReleaseTempRange(pParse, regIdx, pIdx->nColumn);
      sqlite3VdbeResolveLabel(v, addrUniqueOk);
      continue;  /* pIdx is not a UNIQUE index */
    }
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    
    /* Check to see if the new index entry will be unique */
    sqlite3VdbeAddOp4Int(v, OP_NoConflict, iThisCur, addrUniqueOk,
                         regIdx, pIdx->nKeyCol); VdbeCoverage(v);

    /* Generate code to handle collisions */
    regR = (pIdx==pPk) ? regIdx : sqlite3GetTempRange(pParse, nPkField);
    if( isUpdate || onError==OE_Replace ){
      if( HasRowid(pTab) ){
        sqlite3VdbeAddOp2(v, OP_IdxRowid, iThisCur, regR);
        /* Conflict only if the rowid of the existing index entry
        ** is different from old-rowid */
        if( isUpdate ){
          sqlite3VdbeAddOp3(v, OP_Eq, regR, addrUniqueOk, regOldData);
          sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
          VdbeCoverage(v);
        }
      }else{
        int x;
        /* Extract the PRIMARY KEY from the end of the index entry and
        ** store it in registers regR..regR+nPk-1 */
        if( pIdx!=pPk ){
          for(i=0; i<pPk->nKeyCol; i++){
            x = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[i]);
            sqlite3VdbeAddOp3(v, OP_Column, iThisCur, x, regR+i);
            VdbeComment((v, "%s.%s", pTab->zName,
                         pTab->aCol[pPk->aiColumn[i]].zName));
          }
        }
        if( isUpdate ){
          /* If currently processing the PRIMARY KEY of a WITHOUT ROWID 
          ** table, only conflict if the new PRIMARY KEY values are actually
          ** different from the old.
          **
          ** For a UNIQUE index, only conflict if the PRIMARY KEY values
          ** of the matched index row are different from the original PRIMARY
          ** KEY values of this row before the update.  */
          int addrJump = sqlite3VdbeCurrentAddr(v)+pPk->nKeyCol;
          int op = OP_Ne;
          int regCmp = (IsPrimaryKeyIndex(pIdx) ? regIdx : regR);
  
          for(i=0; i<pPk->nKeyCol; i++){
            char *p4 = (char*)sqlite3LocateCollSeq(pParse, pPk->azColl[i]);
            x = pPk->aiColumn[i];
            if( i==(pPk->nKeyCol-1) ){
              addrJump = addrUniqueOk;
              op = OP_Eq;
            }
            sqlite3VdbeAddOp4(v, op, 
                regOldData+1+x, addrJump, regCmp+i, p4, P4_COLLSEQ
            );
            sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
            VdbeCoverageIf(v, op==OP_Eq);
            VdbeCoverageIf(v, op==OP_Ne);
          }
        }
      }
    }

    /* Generate code that executes if the new index entry is not unique */
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace );
    switch( onError ){
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        sqlite3UniqueConstraint(pParse, onError, pIdx);
        break;
      }
      case OE_Ignore: {
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
        break;
      }
      default: {
        Trigger *pTrigger = 0;
        assert( onError==OE_Replace );
        sqlite3MultiWrite(pParse);
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
                                 regR, nPkField, 0, OE_Replace, pIdx==pPk);
        seenReplace = 1;
        break;
      }
    }
    sqlite3VdbeResolveLabel(v, addrUniqueOk);
    sqlite3ReleaseTempRange(pParse, regIdx, pIdx->nColumn);
    if( regR!=regIdx ) sqlite3ReleaseTempRange(pParse, regR, nPkField);
  }
  if( ipkTop ){
    sqlite3VdbeAddOp2(v, OP_Goto, 0, ipkTop+1);
    sqlite3VdbeJumpHere(v, ipkBottom);
  }
  
  *pbMayReplace = seenReplace;
  VdbeModuleComment((v, "END: GenCnstCks(%d)", seenReplace));
}